

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Schema __thiscall capnp::Schema::getDependency(Schema *this,uint64_t id,uint location)

{
  RawBrandedSchema *pRVar1;
  RawSchema *pRVar2;
  Initializer *pIVar3;
  Initializer *pIVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Fault f;
  CappedArray<char,_17UL> local_30;
  
  pRVar1 = this->raw;
  if (pRVar1->dependencyCount != 0) {
    uVar9 = 0;
    uVar5 = (ulong)pRVar1->dependencyCount;
    do {
      uVar8 = uVar9 + (int)uVar5 >> 1;
      uVar6 = (ulong)uVar8;
      uVar7 = pRVar1->dependencies[uVar6].location;
      if (uVar7 == location) {
        pRVar1 = pRVar1->dependencies[uVar6].schema;
        pIVar3 = pRVar1->lazyInitializer;
        if (pIVar3 == (Initializer *)0x0) {
          return (Schema)pRVar1;
        }
        (**pIVar3->_vptr_Initializer)(pIVar3,pRVar1);
        return (Schema)pRVar1;
      }
      if (uVar7 < location) {
        uVar9 = uVar8 + 1;
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
    } while (uVar9 < (uint)uVar6);
  }
  uVar9 = pRVar1->generic->dependencyCount;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      uVar8 = uVar9 + uVar7 >> 1;
      pRVar2 = pRVar1->generic->dependencies[uVar8];
      if (pRVar2->id == id) {
        pIVar4 = pRVar2->lazyInitializer;
        if (pIVar4 != (Initializer *)0x0) {
          (**pIVar4->_vptr_Initializer)(pIVar4,pRVar2);
        }
        return (Schema)&pRVar2->defaultBrand;
      }
      if (pRVar2->id < id) {
        uVar7 = uVar8 + 1;
        uVar8 = uVar9;
      }
      uVar9 = uVar8;
    } while (uVar7 < uVar9);
  }
  kj::hex(&local_30,id);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],kj::CappedArray<char,17ul>>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0xf5,FAILED,(char *)0x0,"\"Requested ID not found in dependency table.\", kj::hex(id)"
             ,(char (*) [44])"Requested ID not found in dependency table.",&local_30);
  kj::_::Debug::Fault::~Fault(&f);
  return (Schema)(RawBrandedSchema *)(_::NULL_SCHEMA + 0x48);
}

Assistant:

Schema Schema::getDependency(uint64_t id, uint location) const {
  {
    // Binary search dependency list.
    uint lower = 0;
    uint upper = raw->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      auto candidate = raw->dependencies[mid];
      if (candidate.location == location) {
        candidate.schema->ensureInitialized();
        return Schema(candidate.schema);
      } else if (candidate.location < location) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  {
    uint lower = 0;
    uint upper = raw->generic->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      const _::RawSchema* candidate = raw->generic->dependencies[mid];

      uint64_t candidateId = candidate->id;
      if (candidateId == id) {
        candidate->ensureInitialized();
        return Schema(&candidate->defaultBrand);
      } else if (candidateId < id) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  KJ_FAIL_REQUIRE("Requested ID not found in dependency table.", kj::hex(id)) {
    return Schema();
  }
}